

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

void __thiscall runtime::VirtualMachine::JumpIfFalse(VirtualMachine *this)

{
  element_type *peVar1;
  bool bVar2;
  Variable VVar3;
  Variable var;
  
  VVar3 = popOpStack(this);
  var.field_1 = VVar3.field_1;
  var._4_4_ = 0;
  var.type = VVar3.type;
  bVar2 = booleanValueOfVariable(this,var);
  if (bVar2) {
    peVar1 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    peVar1->programCounter = peVar1->programCounter + 1;
    return;
  }
  Jump(this);
  return;
}

Assistant:

void runtime::VirtualMachine::JumpIfFalse() {
  Variable top{this->popOpStack()};

  if (!this->booleanValueOfVariable(top)) {
    this->Jump();
  } else {
    this->advance();
  }
}